

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advertise_service_options.h
# Opt level: O1

void __thiscall
miniros::AdvertiseServiceOptions::init<roscpp::GetLoggers>
          (AdvertiseServiceOptions *this,string *_service,
          function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
          *_callback)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>
  *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>
  *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_replace
            ((ulong)&this->md5sum,0,(char *)(this->md5sum)._M_string_length,0x25648f);
  std::__cxx11::string::_M_replace
            ((ulong)&this->datatype,0,(char *)(this->datatype)._M_string_length,0x2564b0);
  std::__cxx11::string::_M_replace
            ((ulong)&this->req_datatype,0,(char *)(this->req_datatype)._M_string_length,0x2564c2);
  std::__cxx11::string::_M_replace
            ((ulong)&this->res_datatype,0,(char *)(this->res_datatype)._M_string_length,0x2564db);
  local_28 = (ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>
              *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>>,roscpp::GetLoggersResponse_<std::allocator<void>>>>,std::allocator<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>>,roscpp::GetLoggersResponse_<std::allocator<void>>>>>,std::function<bool(roscpp::GetLoggersRequest_<std::allocator<void>>&,roscpp::GetLoggersResponse_<std::allocator<void>>&)>const&>
            (&_Stack_20,&local_28,
             (allocator<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>_>
              *)&local_29,_callback);
  _Var2._M_pi = _Stack_20._M_pi;
  pSVar1 = local_28;
  local_28 = (ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>
              *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->helper).
            super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->helper).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = &pSVar1->super_ServiceCallbackHelper;
  (this->helper).super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  return;
}

Assistant:

void init(const std::string& _service, const std::function<bool(typename Service::Request&, typename Service::Response&)>& _callback)
  {
    namespace st = service_traits;
    namespace mt = message_traits;
    typedef typename Service::Request Request;
    typedef typename Service::Response Response;
    service = _service;
    md5sum = st::md5sum<Service>();
    datatype = st::datatype<Service>();
    req_datatype = mt::datatype<Request>();
    res_datatype = mt::datatype<Response>();
    helper = std::make_shared<ServiceCallbackHelperT<ServiceSpec<Request, Response> > >(_callback);
  }